

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<float>
               (float *src,int sstride,int uw,int vw,float *dst,int nchan)

{
  int iVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar5 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar5);
  local_38 = (float)sstride;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar5) = 0x423556;
  memset(__s,0,(long)nchan * 4);
  *(undefined8 *)((long)&uStack_40 + lVar5) = 4;
  iVar1 = (int)local_38 / (int)*(undefined8 *)((long)&uStack_40 + lVar5);
  pfVar2 = src + iVar1 * vw;
  uVar6 = (ulong)(uint)nchan;
  if (nchan < 1) {
    uVar6 = 0;
  }
  while (src != pfVar2) {
    pfVar4 = src + nchan * local_34;
    for (; src != pfVar4; src = (float *)((long)src + lVar5)) {
      for (lVar5 = 0; uVar6 * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
        *(float *)((long)__s + lVar5) =
             *(float *)((long)src + lVar5) + *(float *)((long)__s + lVar5);
      }
    }
    src = pfVar4 + (iVar1 - nchan * local_34);
  }
  for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    dst[uVar3] = *(float *)((long)__s + uVar3 * 4) * (1.0 / (float)(vw * local_34));
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }